

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamepad.c
# Opt level: O0

int __thiscall calibrate_button(VCONTROLLER *this,int i)

{
  _Bool _Var1;
  int in_ESI;
  long in_RDI;
  int c;
  int local_18;
  
  _Var1 = key_down(0x3b);
  if (!_Var1) {
    for (local_18 = 1; local_18 < 0xe3; local_18 = local_18 + 1) {
      _Var1 = key_pressed(local_18);
      if (_Var1) {
        *(int *)(*(long *)(in_RDI + 0x20) + (long)in_ESI * 4) = local_18;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int calibrate_button(VCONTROLLER * this, int i)
{
   (void)this;
   (void)i;
// FIXME
#if 0
   int stickc, axisc, joyc, buttonc;

   poll_joystick();
   joyc = al_get_num_joysticks();
   while (joyc--) {
      /* check axes */
      stickc = joy[joyc].num_sticks;
      while (stickc--) {
         axisc = joy[joyc].stick[stickc].num_axis;
         while (axisc--) {
            if (joy[joyc].stick[stickc].axis[axisc].d1) {
               ((int *)(this->private_data))[i] =
                  4 | 2 | (joyc << 8) | (stickc << 16) | (axisc << 24);
               return 1;
            }

            if (joy[joyc].stick[stickc].axis[axisc].d2) {
               ((int *)(this->private_data))[i] =
                  4 | (joyc << 8) | (stickc << 16) | (axisc << 24);
               return 1;
            }
         }
      }

      /* check buttons */
      buttonc = joy[joyc].num_buttons;
      while (buttonc--) {
         if (joy[joyc].button[buttonc].b) {
            ((int *)(this->private_data))[i] =
               4 | 1 | (joyc << 8) | (buttonc << 16);
            return 1;
         }
      }
   }
#endif
   return 0;
}